

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O0

void __thiscall
dg::vr::StructureAnalyzer::setValidAreasByAssumeBool
          (StructureAnalyzer *this,VRLocation *location,
          vector<bool,_std::allocator<bool>_> *validAreas,VRAssumeBool *assume)

{
  bool bVar1;
  ret_type pIVar2;
  ret_type pCVar3;
  ret_type pCVar4;
  pair<unsigned_int,_const_dg::vr::AllocatedArea_*> *__in;
  reference ppVVar5;
  VRAssume *in_RCX;
  tuple<unsigned_int_&,_const_dg::vr::AllocatedArea_*&> *in_RDI;
  pair<unsigned_int,_const_dg::vr::AllocatedArea_*> pVar6;
  Predicate pred;
  Value *equal;
  iterator __end2;
  iterator __begin2;
  VectorSet<const_llvm::Value_*> *__range2;
  AllocatedArea *area;
  uint index;
  Value *param;
  ConstantInt *c2;
  ConstantInt *c1;
  ICmpInst *icmp;
  VectorSet<const_llvm::Value_*> *in_stack_ffffffffffffff28;
  uint i_nocapture;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  ValueRelations *in_stack_ffffffffffffff68;
  
  VRAssume::getValue(in_RCX);
  pIVar2 = llvm::dyn_cast<llvm::ICmpInst,llvm::Value_const>
                     ((Value *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  if (pIVar2 != (ret_type)0x0) {
    llvm::CmpInst::getOperand
              ((CmpInst *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (uint)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    pCVar3 = llvm::dyn_cast<llvm::ConstantInt,llvm::Value>
                       ((Value *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    llvm::CmpInst::getOperand
              ((CmpInst *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (uint)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    pCVar4 = llvm::dyn_cast<llvm::ConstantInt,llvm::Value>
                       ((Value *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    if (((((pCVar3 == (ret_type)0x0) || (pCVar4 == (ret_type)0x0)) &&
         ((pCVar3 != (ret_type)0x0 || (pCVar4 != (ret_type)0x0)))) &&
        ((pCVar3 != (ret_type)0x0 ||
         (bVar1 = llvm::ConstantInt::isZero((ConstantInt *)0x1f0066), bVar1)))) &&
       ((pCVar4 != (ret_type)0x0 ||
        (bVar1 = llvm::ConstantInt::isZero((ConstantInt *)0x1f0084), bVar1)))) {
      i_nocapture = (uint)((ulong)in_stack_ffffffffffffff28 >> 0x20);
      if (pCVar3 == (ret_type)0x0) {
        __in = (pair<unsigned_int,_const_dg::vr::AllocatedArea_*> *)
               llvm::CmpInst::getOperand
                         ((CmpInst *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          i_nocapture);
      }
      else {
        __in = (pair<unsigned_int,_const_dg::vr::AllocatedArea_*> *)
               llvm::CmpInst::getOperand
                         ((CmpInst *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          i_nocapture);
      }
      ValueRelations::getEqual
                (in_stack_ffffffffffffff68,
                 (V)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      VectorSet<const_llvm::Value_*>::begin(in_stack_ffffffffffffff28);
      VectorSet<const_llvm::Value_*>::end(in_stack_ffffffffffffff28);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                                (__normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                                 *)in_stack_ffffffffffffff28), bVar1) {
        ppVVar5 = __gnu_cxx::
                  __normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                  ::operator*((__normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                               *)&stack0xffffffffffffff88);
        pVar6 = getAllocatedAreaFor((StructureAnalyzer *)*ppVVar5,(Value *)in_stack_ffffffffffffff68
                                   );
        in_stack_ffffffffffffff68 = (ValueRelations *)pVar6.second;
        std::tie<unsigned_int,dg::vr::AllocatedArea_const*>
                  (&__in->first,
                   (AllocatedArea **)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
        std::tuple<unsigned_int&,dg::vr::AllocatedArea_const*&>::operator=(in_RDI,__in);
        __gnu_cxx::
        __normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
        ::operator++((__normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                      *)&stack0xffffffffffffff88);
      }
      VectorSet<const_llvm::Value_*>::~VectorSet((VectorSet<const_llvm::Value_*> *)0x1f01d8);
    }
  }
  return;
}

Assistant:

void StructureAnalyzer::setValidAreasByAssumeBool(VRLocation &location,
                                                  std::vector<bool> &validAreas,
                                                  VRAssumeBool *assume) const {
    const auto *icmp = llvm::dyn_cast<llvm::ICmpInst>(assume->getValue());
    if (!icmp)
        return;

    const auto *c1 = llvm::dyn_cast<llvm::ConstantInt>(icmp->getOperand(0));
    const auto *c2 = llvm::dyn_cast<llvm::ConstantInt>(icmp->getOperand(1));

    // pointer must be compared to zero // TODO? or greater
    if ((c1 && c2) || (!c1 && !c2) || (!c1 && !c2->isZero()) ||
        (!c2 && !c1->isZero()))
        return;

    // get the compared parameter
    const llvm::Value *param = c1 ? icmp->getOperand(1) : icmp->getOperand(0);

    unsigned index = 0;
    const AllocatedArea *area = nullptr;

    for (const auto *equal : location.relations.getEqual(param)) {
        std::tie(index, area) = getAllocatedAreaFor(equal);
        // if compared pointer or equal belong to allocated area, this area
        // can be marked valid
        if (area)
            break;
    }
    // the compared value is not a pointer to an allocated area
    if (!area)
        return;

    llvm::ICmpInst::Predicate pred = assume->getAssumption()
                                             ? icmp->getSignedPredicate()
                                             : icmp->getInversePredicate();

    // check that predicate implies wanted relation
    switch (pred) {
    case llvm::ICmpInst::Predicate::ICMP_EQ:
        // if reallocated pointer is equal to zero, then original memory is
        // still valid
        setValidArea(validAreas, area, index, false);
        return;

    case llvm::ICmpInst::Predicate::ICMP_NE:
        // pointer is not equal to zero, therefore it a valid result of heap
        // allocation
        setValidArea(validAreas, area, index, true);
        return;

    case llvm::ICmpInst::Predicate::ICMP_ULT:
    case llvm::ICmpInst::Predicate::ICMP_SLT:
        // if zero stands right to </<=, this proves invalidity
        if (c2)
            setValidArea(validAreas, area, index, false);
        else
            setValidArea(validAreas, area, index, true);
        return;

    case llvm::ICmpInst::Predicate::ICMP_UGT:
    case llvm::ICmpInst::Predicate::ICMP_SGT:
        // if zero stands left to >/>=, this proves invalidity
        if (c1)
            setValidArea(validAreas, area, index, false);
        else
            setValidArea(validAreas, area, index, true);
        return;

    case llvm::ICmpInst::Predicate::ICMP_ULE:
    case llvm::ICmpInst::Predicate::ICMP_SLE:
    case llvm::ICmpInst::Predicate::ICMP_UGE:
    case llvm::ICmpInst::Predicate::ICMP_SGE:
        // nothing to infer here, we do not get the information, whether
        // pointer is zero or not
        return;

    default:
        assert(0 && "unreachable, would have failed in processICMP");
    }
}